

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O0

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::findPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  btBroadphaseProxy *in_RDX;
  btBroadphaseProxy *in_RSI;
  btBroadphaseProxy *in_RDI;
  btBroadphasePair *pair;
  int findIndex;
  btBroadphasePair tmpPair;
  btBroadphaseProxy *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int n;
  btBroadphasePair local_40;
  btBroadphaseProxy *local_20;
  btBroadphaseProxy *local_18;
  btBroadphasePair *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = needsBroadphaseCollision
                    ((btSortedOverlappingPairCache *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb0,in_RDI);
  if (bVar1) {
    btBroadphasePair::btBroadphasePair(&local_40,local_18,local_20);
    iVar2 = btAlignedObjectArray<btBroadphasePair>::findLinearSearch
                      ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffffb0,
                       (btBroadphasePair *)in_RDI);
    n = iVar2;
    iVar3 = btAlignedObjectArray<btBroadphasePair>::size
                      ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_collisionFilterGroup);
    if (iVar2 < iVar3) {
      local_8 = btAlignedObjectArray<btBroadphasePair>::operator[]
                          ((btAlignedObjectArray<btBroadphasePair> *)&in_RDI->m_collisionFilterGroup
                           ,n);
    }
    else {
      local_8 = (btBroadphasePair *)0x0;
    }
  }
  else {
    local_8 = (btBroadphasePair *)0x0;
  }
  return local_8;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;

	btBroadphasePair tmpPair(*proxy0,*proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//btAssert(it != m_overlappingPairSet.end());
		 btBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}